

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc.c
# Opt level: O2

int ipc_helper(int listen_after_write)

{
  int iVar1;
  undefined8 uVar2;
  uv_loop_t *loop;
  char *pcVar3;
  sockaddr_in addr;
  undefined1 local_20 [16];
  
  iVar1 = uv_ip4_addr("0.0.0.0",0x23a3,&addr);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_pipe_init(uVar2,&channel,1);
    if (iVar1 == 0) {
      uv_pipe_open(&channel,0);
      iVar1 = uv_is_readable(&channel);
      if (iVar1 == 1) {
        iVar1 = uv_is_writable(&channel);
        if (iVar1 == 1) {
          iVar1 = uv_is_closing(&channel);
          if (iVar1 == 0) {
            uVar2 = uv_default_loop();
            iVar1 = uv_tcp_init(uVar2,&tcp_server);
            if (iVar1 == 0) {
              iVar1 = uv_tcp_bind(&tcp_server,&addr,0);
              if (iVar1 == 0) {
                if (listen_after_write == 0) {
                  iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection);
                  if (iVar1 != 0) {
                    pcVar3 = "r == 0";
                    uVar2 = 0x2ef;
                    goto LAB_0013a979;
                  }
                }
                local_20 = uv_buf_init("hello\n",6);
                iVar1 = uv_write2(&write_req,&channel,local_20,1,&tcp_server,0);
                if (iVar1 == 0) {
                  if (listen_after_write != 0) {
                    iVar1 = uv_listen(&tcp_server,0x80,ipc_on_connection);
                    if (iVar1 != 0) {
                      pcVar3 = "r == 0";
                      uVar2 = 0x2f9;
                      goto LAB_0013a979;
                    }
                  }
                  notify_parent_process();
                  uVar2 = uv_default_loop();
                  iVar1 = uv_run(uVar2,0);
                  if (iVar1 == 0) {
                    if (connection_accepted == '\0') {
                      pcVar3 = "connection_accepted == 1";
                      uVar2 = 0x300;
                    }
                    else if (close_cb_called == 3) {
                      loop = (uv_loop_t *)uv_default_loop();
                      close_loop(loop);
                      uVar2 = uv_default_loop();
                      iVar1 = uv_loop_close(uVar2);
                      if (iVar1 == 0) {
                        return 0;
                      }
                      pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                      uVar2 = 0x303;
                    }
                    else {
                      pcVar3 = "close_cb_called == 3";
                      uVar2 = 0x301;
                    }
                  }
                  else {
                    pcVar3 = "r == 0";
                    uVar2 = 0x2fe;
                  }
                }
                else {
                  pcVar3 = "r == 0";
                  uVar2 = 0x2f5;
                }
              }
              else {
                pcVar3 = "r == 0";
                uVar2 = 0x2eb;
              }
            }
            else {
              pcVar3 = "r == 0";
              uVar2 = 0x2e8;
            }
          }
          else {
            pcVar3 = "0 == uv_is_closing((uv_handle_t*) &channel)";
            uVar2 = 0x2e5;
          }
        }
        else {
          pcVar3 = "1 == uv_is_writable((uv_stream_t*) &channel)";
          uVar2 = 0x2e4;
        }
      }
      else {
        pcVar3 = "1 == uv_is_readable((uv_stream_t*) &channel)";
        uVar2 = 0x2e3;
      }
    }
    else {
      pcVar3 = "r == 0";
      uVar2 = 0x2df;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"0.0.0.0\", TEST_PORT, &addr)";
    uVar2 = 0x2dc;
  }
LAB_0013a979:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ipc.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

int ipc_helper(int listen_after_write) {
  /*
   * This is launched from test-ipc.c. stdin is a duplex channel that we
   * over which a handle will be transmitted.
   */
  struct sockaddr_in addr;
  int r;
  uv_buf_t buf;

  ASSERT(0 == uv_ip4_addr("0.0.0.0", TEST_PORT, &addr));

  r = uv_pipe_init(uv_default_loop(), &channel, 1);
  ASSERT(r == 0);

  uv_pipe_open(&channel, 0);

  ASSERT(1 == uv_is_readable((uv_stream_t*) &channel));
  ASSERT(1 == uv_is_writable((uv_stream_t*) &channel));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &channel));

  r = uv_tcp_init(uv_default_loop(), &tcp_server);
  ASSERT(r == 0);

  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);

  if (!listen_after_write) {
    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection);
    ASSERT(r == 0);
  }

  buf = uv_buf_init("hello\n", 6);
  r = uv_write2(&write_req, (uv_stream_t*)&channel, &buf, 1,
      (uv_stream_t*)&tcp_server, NULL);
  ASSERT(r == 0);

  if (listen_after_write) {
    r = uv_listen((uv_stream_t*)&tcp_server, BACKLOG, ipc_on_connection);
    ASSERT(r == 0);
  }

  notify_parent_process();
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(connection_accepted == 1);
  ASSERT(close_cb_called == 3);

  MAKE_VALGRIND_HAPPY();
  return 0;
}